

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O2

Bytes __thiscall
Omega_h::prevent_coarsen_flip_dim<2>(Omega_h *this,Mesh *mesh,LOs *cands2edges,Bytes *cand_codes)

{
  Bytes cand_codes_00;
  LO nb;
  void *extraout_RDX;
  Bytes BVar1;
  Read<signed_char> verts_matter;
  Bytes sides_matter;
  Read<signed_char> sides_are_exposed;
  Write<int> local_130;
  Write<double> local_120;
  Write<signed_char> local_110;
  Write<signed_char> local_100;
  Write<signed_char> local_f0;
  Write<signed_char> local_e0;
  Reals vert_normals;
  Write<signed_char> local_c0;
  Write<signed_char> local_b0;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Read<signed_char> sides_are_adj;
  Write<signed_char> local_70;
  Read<signed_char> verts_are_cands;
  Write<int> local_50;
  Read<signed_char> edges_are_cands;
  
  Write<int>::Write(&local_50,&cands2edges->write_);
  nb = Mesh::nedges(mesh);
  mark_image((Omega_h *)&edges_are_cands,(LOs *)&local_50,nb);
  Write<int>::~Write(&local_50);
  Write<signed_char>::Write(&local_70,&edges_are_cands.write_);
  mark_down((Omega_h *)&verts_are_cands,mesh,1,0,(Read<signed_char> *)&local_70);
  Write<signed_char>::~Write(&local_70);
  Write<signed_char>::Write(&local_90,&verts_are_cands.write_);
  mark_up((Omega_h *)&sides_are_adj,mesh,0,1,(Read<signed_char> *)&local_90);
  Write<signed_char>::~Write(&local_90);
  mark_exposed_sides((Omega_h *)&sides_are_exposed,mesh);
  Write<signed_char>::Write(&local_a0,&sides_are_adj.write_);
  Write<signed_char>::Write(&local_b0,&sides_are_exposed.write_);
  land_each((Omega_h *)&sides_matter,(Bytes *)&local_a0,(Bytes *)&local_b0);
  Write<signed_char>::~Write(&local_b0);
  Write<signed_char>::~Write(&local_a0);
  Write<signed_char>::Write(&local_c0,&sides_matter.write_);
  mark_down((Omega_h *)&verts_matter,mesh,1,0,(Read<signed_char> *)&local_c0);
  Write<signed_char>::~Write(&local_c0);
  Write<signed_char>::Write(&local_e0,&sides_are_exposed.write_);
  Write<signed_char>::Write(&local_f0,&verts_matter.write_);
  compute_flip_normals_dim<2>
            ((Omega_h *)&vert_normals,mesh,(Bytes *)&local_e0,(Bytes *)&local_f0,0.95);
  Write<signed_char>::~Write(&local_f0);
  Write<signed_char>::~Write(&local_e0);
  Write<signed_char>::Write(&local_100,&sides_matter.write_);
  Write<signed_char>::Write(&local_110,&verts_matter.write_);
  Write<double>::Write(&local_120,&vert_normals.write_);
  Write<int>::Write(&local_130,&cands2edges->write_);
  Write<signed_char>::Write((Write<signed_char> *)&stack0xffffffffffffffd0,&cand_codes->write_);
  cand_codes_00.write_.shared_alloc_.direct_ptr = verts_matter.write_.shared_alloc_.alloc;
  cand_codes_00.write_.shared_alloc_.alloc = (Alloc *)&stack0xffffffffffffffd0;
  prevent_coarsen_flip2_dim<2>
            (this,mesh,(Bytes *)&local_100,(Bytes *)&local_110,(Reals *)&local_120,(LOs *)&local_130
             ,cand_codes_00,1e-10);
  Write<signed_char>::~Write((Write<signed_char> *)&stack0xffffffffffffffd0);
  Write<int>::~Write(&local_130);
  Write<double>::~Write(&local_120);
  Write<signed_char>::~Write(&local_110);
  Write<signed_char>::~Write(&local_100);
  Write<double>::~Write(&vert_normals.write_);
  Write<signed_char>::~Write(&verts_matter.write_);
  Write<signed_char>::~Write(&sides_matter.write_);
  Write<signed_char>::~Write(&sides_are_exposed.write_);
  Write<signed_char>::~Write(&sides_are_adj.write_);
  Write<signed_char>::~Write(&verts_are_cands.write_);
  Write<signed_char>::~Write(&edges_are_cands.write_);
  BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar1.write_.shared_alloc_;
}

Assistant:

Bytes prevent_coarsen_flip_dim(
    Mesh* mesh, LOs cands2edges, Bytes cand_codes) {
  auto edges_are_cands = mark_image(cands2edges, mesh->nedges());
  auto verts_are_cands = mark_down(mesh, EDGE, VERT, edges_are_cands);
  auto side_dim = dim - 1;
  auto sides_are_adj = mark_up(mesh, VERT, side_dim, verts_are_cands);
  auto sides_are_exposed = mark_exposed_sides(mesh);
  auto sides_matter = land_each(sides_are_adj, sides_are_exposed);
  auto verts_matter = mark_down(mesh, side_dim, VERT, sides_matter);
  auto vert_normals =
      compute_flip_normals_dim<dim>(mesh, sides_are_exposed, verts_matter);
  auto new_codes = prevent_coarsen_flip2_dim<dim>(
      mesh, sides_matter, verts_matter, vert_normals, cands2edges, cand_codes);
  return new_codes;
}